

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::EqExp(SQCompiler *this)

{
  long lVar1;
  SQOpcode op;
  
  CompExp(this);
  do {
    while (lVar1 = this->_token, lVar1 == 0x131) {
      BIN_EXP<void(SQCompiler::*)()>(this,_OP_CMP,0x1199ec,0);
    }
    if (lVar1 == 0x109) {
      op = _OP_NE;
    }
    else {
      if (lVar1 != 0x108) {
        return;
      }
      op = _OP_EQ;
    }
    BIN_EXP<void(SQCompiler::*)()>(this,op,0x1199ec,0);
  } while( true );
}

Assistant:

void EqExp()
    {
        CompExp();
        for(;;) switch(_token) {
        case TK_EQ: BIN_EXP(_OP_EQ, &SQCompiler::CompExp); break;
        case TK_NE: BIN_EXP(_OP_NE, &SQCompiler::CompExp); break;
        case TK_3WAYSCMP: BIN_EXP(_OP_CMP, &SQCompiler::CompExp,CMP_3W); break;
        default: return;
        }
    }